

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestCoverageCommand.cxx
# Opt level: O0

cmCTestGenericHandler * __thiscall
cmCTestCoverageCommand::InitializeHandler(cmCTestCoverageCommand *this)

{
  cmMakefile *pcVar1;
  cmCTest *pcVar2;
  allocator<char> local_a1;
  string local_a0;
  cmCTestCoverageHandler *local_80;
  cmCTestCoverageHandler *handler;
  string local_70;
  allocator<char> local_39;
  string local_38;
  cmCTestCoverageCommand *local_18;
  cmCTestCoverageCommand *this_local;
  
  pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
  pcVar2 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest;
  local_18 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"CTEST_COVERAGE_COMMAND",&local_39);
  cmCTest::SetCTestConfigurationFromCMakeVariable
            (pcVar2,pcVar1,"CoverageCommand",&local_38,
             (bool)((this->super_cmCTestHandlerCommand).Quiet & 1));
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
  pcVar2 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,"CTEST_COVERAGE_EXTRA_FLAGS",
             (allocator<char> *)((long)&handler + 7));
  cmCTest::SetCTestConfigurationFromCMakeVariable
            (pcVar2,pcVar1,"CoverageExtraFlags",&local_70,
             (bool)((this->super_cmCTestHandlerCommand).Quiet & 1));
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator((allocator<char> *)((long)&handler + 7));
  local_80 = (cmCTestCoverageHandler *)
             cmCTest::GetInitializedHandler
                       ((this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest,"coverage");
  if (local_80 == (cmCTestCoverageHandler *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a0,"internal CTest error. Cannot instantiate test handler",&local_a1
              );
    cmCommand::SetError((cmCommand *)this,&local_a0);
    std::__cxx11::string::~string((string *)&local_a0);
    std::allocator<char>::~allocator(&local_a1);
    this_local = (cmCTestCoverageCommand *)0x0;
  }
  else {
    if ((this->LabelsMentioned & 1U) != 0) {
      cmCTestCoverageHandler::SetLabelFilter(local_80,&this->Labels);
    }
    cmCTestGenericHandler::SetQuiet
              (&local_80->super_cmCTestGenericHandler,
               (bool)((this->super_cmCTestHandlerCommand).Quiet & 1));
    this_local = (cmCTestCoverageCommand *)local_80;
  }
  return (cmCTestGenericHandler *)this_local;
}

Assistant:

cmCTestGenericHandler* cmCTestCoverageCommand::InitializeHandler()
{
  this->CTest->SetCTestConfigurationFromCMakeVariable(
    this->Makefile, "CoverageCommand", "CTEST_COVERAGE_COMMAND", this->Quiet);
  this->CTest->SetCTestConfigurationFromCMakeVariable(
    this->Makefile, "CoverageExtraFlags", "CTEST_COVERAGE_EXTRA_FLAGS",
    this->Quiet);
  cmCTestCoverageHandler* handler = static_cast<cmCTestCoverageHandler*>(
    this->CTest->GetInitializedHandler("coverage"));
  if (!handler) {
    this->SetError("internal CTest error. Cannot instantiate test handler");
    return nullptr;
  }

  // If a LABELS option was given, select only files with the labels.
  if (this->LabelsMentioned) {
    handler->SetLabelFilter(this->Labels);
  }

  handler->SetQuiet(this->Quiet);
  return handler;
}